

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderExtensionTestCase::ShaderExtensionTestCase
          (ShaderExtensionTestCase *this,Context *context,string *extension)

{
  pointer pcVar1;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"ShaderExtension",
             "Verifies if extension is available for GLSL");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderExtensionTestCase_020e2418;
  (this->mExtension)._M_dataplus._M_p = (pointer)&(this->mExtension).field_2;
  pcVar1 = (extension->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mExtension,pcVar1,pcVar1 + extension->_M_string_length);
  return;
}

Assistant:

ShaderExtensionTestCase::ShaderExtensionTestCase(deqp::Context& context, const std::string extension)
	: TestCase(context, "ShaderExtension", "Verifies if extension is available for GLSL"), mExtension(extension)
{
	/* Left blank intentionally */
}